

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O3

void ihevc_deblk_luma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 bs,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 beta_offset_div2,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  byte bVar29;
  byte bVar30;
  uint uVar31;
  byte bVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  
  if (bs < 1) {
    __assert_fail("((bs > 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x162,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (filter_flag_q == 0 && filter_flag_p == 0) {
    __assert_fail("(filter_flag_p || filter_flag_q)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                  ,0x163,
                  "void ihevc_deblk_luma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  iVar8 = quant_param_p + quant_param_q + 1 >> 1;
  uVar23 = iVar8 + beta_offset_div2 * 2;
  if ((int)uVar23 < 1) {
    uVar23 = 0;
  }
  uVar5 = 0x33;
  if ((int)uVar23 < 0x33) {
    uVar5 = (ulong)uVar23;
  }
  uVar23 = (bs & 0x7ffffffeU) + iVar8 + tc_offset_div2 * 2;
  uVar27 = 0;
  if (0 < (int)uVar23) {
    uVar27 = uVar23;
  }
  uVar11 = 0x35;
  if ((int)uVar27 < 0x35) {
    uVar11 = (ulong)uVar27;
  }
  uVar23 = gai4_ihevc_tc_table[uVar11];
  if (uVar23 == 0) {
    return;
  }
  uVar27 = gai4_ihevc_beta_table[uVar5];
  lVar33 = (long)src_strd;
  bVar13 = *pu1_src;
  iVar9 = (uint)pu1_src[lVar33 * 2] + (uint)pu1_src[lVar33] * -2 + (uint)bVar13;
  iVar8 = -iVar9;
  if (0 < iVar9) {
    iVar8 = iVar9;
  }
  uVar4 = (uint)pu1_src[3];
  iVar24 = (uint)pu1_src[lVar33 * 2 + 3] + (uint)pu1_src[lVar33 + 3] * -2 + uVar4;
  iVar9 = -iVar24;
  if (0 < iVar24) {
    iVar9 = iVar24;
  }
  lVar3 = lVar33 * 2;
  lVar2 = lVar33 * 3;
  bVar29 = pu1_src[-lVar33];
  iVar25 = (uint)pu1_src[lVar33 * -3] + (uint)pu1_src[lVar33 * -2] * -2 + (uint)bVar29;
  iVar24 = -iVar25;
  if (0 < iVar25) {
    iVar24 = iVar25;
  }
  iVar16 = (uint)(pu1_src + -lVar33)[3] +
           (uint)pu1_src[3 - (long)(int)lVar2] + (uint)pu1_src[3 - (long)(int)lVar3] * -2;
  iVar25 = -iVar16;
  if (0 < iVar16) {
    iVar25 = iVar16;
  }
  if ((int)uVar27 <= iVar25 + iVar9 + iVar24 + iVar8) {
    return;
  }
  if ((uint)((iVar24 + iVar8) * 2) < uVar27 >> 2) {
    iVar35 = (uint)pu1_src[lVar2] - (uint)bVar13;
    iVar16 = -iVar35;
    if (0 < iVar35) {
      iVar16 = iVar35;
    }
    iVar34 = (uint)bVar29 - (uint)pu1_src[lVar33 * -4];
    iVar35 = -iVar34;
    if (0 < iVar34) {
      iVar35 = iVar34;
    }
    if ((uint)(iVar35 + iVar16) < uVar27 >> 3) {
      iVar35 = (uint)bVar13 - (uint)bVar29;
      iVar16 = -iVar35;
      if (0 < iVar35) {
        iVar16 = iVar35;
      }
      bVar1 = iVar16 < (int)(uVar23 * 5 + 1) >> 1;
      goto LAB_0015c5bd;
    }
  }
  bVar1 = false;
LAB_0015c5bd:
  lVar20 = -lVar33;
  if ((uint)((iVar25 + iVar9) * 2) < uVar27 >> 2) {
    iVar35 = pu1_src[lVar2 + 3] - uVar4;
    iVar16 = -iVar35;
    if (0 < iVar35) {
      iVar16 = iVar35;
    }
    lVar22 = lVar33 * -4;
    iVar35 = (uint)pu1_src[lVar20 + 3] - (uint)pu1_src[lVar33 * -4 + 3];
    bVar13 = (byte)iVar35;
    bVar29 = -bVar13;
    if (0 < iVar35) {
      bVar29 = bVar13;
    }
    if ((uint)bVar29 + iVar16 < uVar27 >> 3) {
      iVar35 = uVar4 - pu1_src[lVar20 + 3];
      iVar16 = -iVar35;
      if (0 < iVar35) {
        iVar16 = iVar35;
      }
      bVar12 = iVar16 < (int)(uVar23 * 5 + 1) >> 1;
    }
    else {
      bVar12 = false;
    }
  }
  else {
    lVar22 = (long)(src_strd * -4);
    bVar12 = false;
  }
  uVar14 = (uVar27 >> 1) + uVar27 >> 3;
  iVar16 = uVar23 * 2;
  uVar27 = uVar23 >> 1;
  uVar4 = -uVar27;
  lVar6 = 0;
  do {
    bVar13 = pu1_src[lVar6 + lVar20];
    uVar31 = (uint)bVar13;
    bVar29 = pu1_src[lVar6 + lVar33 * -2];
    uVar21 = (uint)bVar29;
    bVar30 = pu1_src[lVar6 + lVar33 * -3];
    uVar26 = (uint)bVar30;
    bVar15 = pu1_src[lVar6];
    uVar18 = (uint)bVar15;
    bVar7 = pu1_src[lVar6 + lVar33];
    uVar10 = (uint)bVar7;
    bVar32 = pu1_src[lVar6 + lVar3];
    uVar28 = (uint)bVar32;
    if ((bool)(bVar1 & bVar12)) {
      iVar35 = uVar31 + uVar18 + uVar10;
      uVar17 = uVar21 + uVar28 + iVar35 * 2 + 4 >> 3;
      uVar19 = uVar18 + uVar23 * -2;
      if ((int)uVar19 < (int)uVar17) {
        uVar19 = uVar17;
      }
      if ((int)(iVar16 + uVar18) < (int)uVar17) {
        uVar19 = iVar16 + uVar18;
      }
      bVar15 = (byte)uVar19;
      uVar17 = uVar28 + iVar35 + 2 >> 2;
      uVar19 = uVar10 + uVar23 * -2;
      if ((int)uVar19 < (int)uVar17) {
        uVar19 = uVar17;
      }
      if ((int)(uVar10 + iVar16) < (int)uVar17) {
        uVar19 = uVar10 + iVar16;
      }
      bVar7 = (byte)uVar19;
      uVar17 = uVar28 * 3 + iVar35 + (uint)pu1_src[lVar6 + lVar2] * 2 + 4 >> 3;
      uVar19 = uVar28 + uVar23 * -2;
      if ((int)uVar19 < (int)uVar17) {
        uVar19 = uVar17;
      }
      iVar35 = uVar31 + uVar18 + uVar21;
      uVar18 = uVar10 + uVar26 + iVar35 * 2 + 4 >> 3;
      uVar10 = uVar31 + uVar23 * -2;
      if ((int)uVar10 < (int)uVar18) {
        uVar10 = uVar18;
      }
      if ((int)(uVar31 + iVar16) < (int)uVar18) {
        uVar10 = uVar31 + iVar16;
      }
      bVar13 = (byte)uVar10;
      uVar18 = uVar26 + iVar35 + 2 >> 2;
      uVar10 = uVar21 + uVar23 * -2;
      if ((int)uVar10 < (int)uVar18) {
        uVar10 = uVar18;
      }
      if ((int)(uVar21 + iVar16) < (int)uVar18) {
        uVar10 = uVar21 + iVar16;
      }
      uVar21 = uVar26 * 3 + iVar35 + (uint)pu1_src[lVar6 + lVar22] * 2 + 4 >> 3;
      uVar18 = uVar26 + uVar23 * -2;
      if ((int)uVar18 < (int)uVar21) {
        uVar18 = uVar21;
      }
      if ((int)(uVar26 + iVar16) < (int)uVar21) {
        uVar18 = uVar26 + iVar16;
      }
      if ((int)(uVar28 + iVar16) < (int)uVar17) {
        uVar19 = uVar28 + iVar16;
      }
      bVar29 = (byte)uVar10;
      bVar30 = (byte)uVar18;
      bVar32 = (byte)uVar19;
    }
    else {
      uVar17 = (int)((uVar18 - uVar31) * 9 + (uVar10 - uVar21) * -3 + 8) >> 4;
      uVar19 = -uVar17;
      if (0 < (int)uVar17) {
        uVar19 = uVar17;
      }
      if ((int)uVar19 < (int)(uVar23 * 10)) {
        uVar19 = -uVar23;
        if ((int)-uVar23 < (int)uVar17) {
          uVar19 = uVar17;
        }
        if ((int)uVar23 < (int)uVar17) {
          uVar19 = uVar23;
        }
        iVar35 = uVar19 + uVar31;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0xfe < iVar35) {
          iVar35 = 0xff;
        }
        bVar13 = (byte)iVar35;
        iVar35 = uVar18 - uVar19;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0xfe < iVar35) {
          iVar35 = 0xff;
        }
        bVar15 = (byte)iVar35;
        if ((uint)(iVar25 + iVar24) < uVar14 && 1 < (int)uVar23) {
          uVar31 = (int)(((uVar26 + uVar31 + 1 >> 1 & 0xff) - uVar21) + uVar19) >> 1;
          uVar26 = uVar31;
          if ((int)uVar31 <= (int)uVar4) {
            uVar26 = uVar4;
          }
          if ((int)uVar27 < (int)uVar31) {
            uVar26 = uVar27;
          }
          iVar35 = uVar26 + uVar21;
          bVar29 = 0xff;
          if (iVar35 < 0x100) {
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            bVar29 = (byte)iVar35;
          }
        }
        if ((uint)(iVar9 + iVar8) < uVar14 && 1 < (int)uVar23) {
          uVar21 = (int)((uVar28 + uVar18 + 1 >> 1 & 0xff) - (uVar19 + uVar10)) >> 1;
          uVar18 = uVar21;
          if ((int)uVar21 <= (int)uVar4) {
            uVar18 = uVar4;
          }
          if ((int)uVar27 < (int)uVar21) {
            uVar18 = uVar27;
          }
          iVar35 = uVar18 + uVar10;
          if (iVar35 < 0x100) {
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            bVar7 = (byte)iVar35;
          }
          else {
            bVar7 = 0xff;
          }
        }
      }
    }
    if (filter_flag_p != 0) {
      pu1_src[lVar6 + lVar33 * -3] = bVar30;
      pu1_src[lVar6 + lVar33 * -2] = bVar29;
      pu1_src[lVar6 + lVar20] = bVar13;
    }
    if (filter_flag_q != 0) {
      pu1_src[lVar6] = bVar15;
      pu1_src[lVar6 + lVar33] = bVar7;
      pu1_src[lVar6 + lVar3] = bVar32;
    }
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  return;
}

Assistant:

void ihevc_deblk_luma_horz(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 bs,
                           WORD32 quant_param_p,
                           WORD32 quant_param_q,
                           WORD32 beta_offset_div2,
                           WORD32 tc_offset_div2,
                           WORD32 filter_flag_p,
                           WORD32 filter_flag_q)
{
    WORD32 qp_luma, beta_indx, tc_indx;
    WORD32 beta, tc;
    WORD32 dp0, dp3, dq0, dq3, d0, d3, dp, dq, d;
    WORD32 d_sam0, d_sam3;
    WORD32 de, dep, deq;
    WORD32 col;
    WORD32 tmp_p0, tmp_p1, tmp_p2, tmp_q0, tmp_q1, tmp_q2;
    WORD32 delta, delta_p, delta_q;

    ASSERT((bs > 0));
    ASSERT(filter_flag_p || filter_flag_q);

    qp_luma = (quant_param_p + quant_param_q + 1) >> 1;
    beta_indx = CLIP3(qp_luma + (beta_offset_div2 << 1), 0, 51);

    /* BS based on implementation can take value 3 if it is intra/inter egde          */
    /* based on BS, tc index is calcuated by adding 2 * ( bs - 1) to QP and tc_offset */
    /* for BS = 1 adding factor is (0*2), BS = 2 or 3 adding factor is (1*2)          */
    /* the above desired functionallity is achieved by doing (2*(bs>>1))              */

    tc_indx = CLIP3(qp_luma + 2 * (bs >> 1) + (tc_offset_div2 << 1), 0, 53);

    beta = gai4_ihevc_beta_table[beta_indx];
    tc = gai4_ihevc_tc_table[tc_indx];
    if(0 == tc)
    {
        return;
    }

    dq0 = ABS(pu1_src[2 * src_strd] - 2 * pu1_src[1 * src_strd] +
                    pu1_src[0 * src_strd]);

    dq3 = ABS(pu1_src[3 + 2 * src_strd] - 2 * pu1_src[3 + 1 * src_strd] +
                    pu1_src[3 + 0 * src_strd]);

    dp0 = ABS(pu1_src[-3 * src_strd] - 2 * pu1_src[-2 * src_strd] +
                    pu1_src[-1 * src_strd]);

    dp3 = ABS(pu1_src[3 - 3 * src_strd] - 2 * pu1_src[3 - 2 * src_strd] +
                    pu1_src[3 - 1 * src_strd]);

    d0 = dp0 + dq0;
    d3 = dp3 + dq3;

    dp = dp0 + dp3;
    dq = dq0 + dq3;

    d = d0 + d3;

    de = 0;
    dep = 0;
    deq = 0;

    if(d < beta)
    {
        d_sam0 = 0;
        if((2 * d0 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam0 = 1;
        }

        pu1_src += 3;
        d_sam3 = 0;
        if((2 * d3 < (beta >> 2))
                        && (ABS(pu1_src[3 * src_strd] - pu1_src[0 * src_strd]) +
                                        ABS(pu1_src[-1 * src_strd] - pu1_src[-4 * src_strd])
                                        < (beta >> 3))
                        && ABS(pu1_src[0 * src_strd] - pu1_src[-1 * src_strd])
                        < ((5 * tc + 1) >> 1))
        {
            d_sam3 = 1;
        }
        pu1_src -= 3;

        de = (d_sam0 == 1 && d_sam3 == 1) ? 2 : 1;
        dep = (dp < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        deq = (dq < ((beta + (beta >> 1)) >> 3)) ? 1 : 0;
        if(tc <= 1)
        {
            dep = 0;
            deq = 0;
        }
    }

    if(de != 0)
    {
        for(col = 0; col < 4; col++)
        {
            tmp_p0 = pu1_src[-1 * src_strd];
            tmp_p1 = pu1_src[-2 * src_strd];
            tmp_p2 = pu1_src[-3 * src_strd];

            tmp_q0 = pu1_src[0 * src_strd];
            tmp_q1 = pu1_src[1 * src_strd];
            tmp_q2 = pu1_src[2 * src_strd];
            if(de == 2)
            {
                tmp_q0 = CLIP3((pu1_src[2 * src_strd] +
                                2 * pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] + 4) >> 3,
                                pu1_src[0 * src_strd] - 2 * tc,
                                pu1_src[0 * src_strd] + 2 * tc);

                tmp_q1 = CLIP3((pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 2) >> 2,
                                pu1_src[1 * src_strd] - 2 * tc,
                                pu1_src[1 * src_strd] + 2 * tc);

                tmp_q2 = CLIP3((2 * pu1_src[3 * src_strd] +
                                3 * pu1_src[2 * src_strd] +
                                pu1_src[1 * src_strd] +
                                pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] + 4) >> 3,
                                pu1_src[2 * src_strd] - 2 * tc,
                                pu1_src[2 * src_strd] + 2 * tc);

                tmp_p0 = CLIP3((pu1_src[1 * src_strd] +
                                2 * pu1_src[0 * src_strd] +
                                2 * pu1_src[-1 * src_strd] +
                                2 * pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 4) >> 3,
                                pu1_src[-1 * src_strd] - 2 * tc,
                                pu1_src[-1 * src_strd] + 2 * tc);

                tmp_p1 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                pu1_src[-3 * src_strd] + 2) >> 2,
                                pu1_src[-2 * src_strd] - 2 * tc,
                                pu1_src[-2 * src_strd] + 2 * tc);

                tmp_p2 = CLIP3((pu1_src[0 * src_strd] +
                                pu1_src[-1 * src_strd] +
                                pu1_src[-2 * src_strd] +
                                3 * pu1_src[-3 * src_strd] +
                                2 * pu1_src[-4 * src_strd] + 4) >> 3,
                                pu1_src[-3 * src_strd] - 2 * tc,
                                pu1_src[-3 * src_strd] + 2 * tc);
            }
            else
            {
                delta = (9 * (pu1_src[0 * src_strd] - pu1_src[-1 * src_strd]) -
                                3 * (pu1_src[1 * src_strd] - pu1_src[-2 * src_strd]) +
                                8) >> 4;
                if(ABS(delta) < 10 * tc)
                {
                    delta = CLIP3(delta, -tc, tc);

                    tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
                    tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

                    if(dep == 1)
                    {
                        delta_p = CLIP3((((pu1_src[-3 * src_strd] +
                                        pu1_src[-1 * src_strd] + 1) >> 1) -
                                        pu1_src[-2 * src_strd] + delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_p1 = CLIP_U8(pu1_src[-2 * src_strd] + delta_p);
                    }

                    if(deq == 1)
                    {
                        delta_q = CLIP3((((pu1_src[2 * src_strd] +
                                        pu1_src[0 * src_strd] + 1) >> 1) -
                                        pu1_src[1 * src_strd] - delta) >> 1,
                                        -(tc >> 1),
                                        (tc >> 1));
                        tmp_q1 = CLIP_U8(pu1_src[1 * src_strd] + delta_q);
                    }
                }
            }

            if(filter_flag_p != 0)
            {
                pu1_src[-3 * src_strd] = tmp_p2;
                pu1_src[-2 * src_strd] = tmp_p1;
                pu1_src[-1 * src_strd] = tmp_p0;
            }

            if(filter_flag_q != 0)
            {
                pu1_src[0 * src_strd] = tmp_q0;
                pu1_src[1 * src_strd] = tmp_q1;
                pu1_src[2 * src_strd] = tmp_q2;
            }

            pu1_src += 1;
        }
    }

}